

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

cbtScalar gjkepa2_impl::GJK::projectorigin
                    (cbtVector3 *a,cbtVector3 *b,cbtVector3 *c,cbtVector3 *d,cbtScalar *w,U *m)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  cbtVector3 *b_00;
  cbtVector3 *a_00;
  cbtVector3 *b_01;
  long lVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  cbtScalar cVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [64];
  U subm;
  cbtScalar subw [3];
  cbtVector3 dl [3];
  cbtVector3 *vt [4];
  U local_c0;
  float local_bc;
  cbtScalar local_b8 [4];
  U *local_a8;
  cbtVector3 *local_a0;
  cbtVector3 *local_98;
  cbtVector3 *local_90;
  undefined1 local_88 [4];
  float afStack_84 [3];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  cbtVector3 *local_58 [5];
  
  local_58[0] = a;
  local_58[1] = b;
  local_58[2] = c;
  local_58[3] = d;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)a->m_floats;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)d->m_floats;
  fVar1 = a->m_floats[2];
  fVar22 = d->m_floats[2];
  auVar6 = vsubps_avx(auVar18,auVar20);
  fVar23 = fVar1 - fVar22;
  _local_88 = vinsertps_avx(auVar6,ZEXT416((uint)fVar23),0x28);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)b->m_floats;
  fVar2 = b->m_floats[2];
  auVar7 = vsubps_avx(auVar19,auVar20);
  fVar9 = fVar2 - fVar22;
  local_78 = vinsertps_avx(auVar7,ZEXT416((uint)fVar9),0x28);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)c->m_floats;
  auVar8 = vsubps_avx(auVar21,auVar20);
  auVar20 = vmovshdup_avx(auVar8);
  fVar22 = c->m_floats[2] - fVar22;
  local_68 = vinsertps_avx(auVar8,ZEXT416((uint)fVar22),0x28);
  auVar4 = vmovshdup_avx(auVar6);
  auVar5 = vmovshdup_avx(auVar7);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * auVar7._0_4_ * auVar20._0_4_)),auVar8,
                            ZEXT416((uint)(auVar4._0_4_ * fVar9)));
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)(fVar9 * auVar6._0_4_)),auVar20,auVar12);
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)(auVar7._0_4_ * auVar4._0_4_)),ZEXT416((uint)fVar22),
                             auVar20);
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)(auVar5._0_4_ * auVar6._0_4_)),ZEXT416((uint)fVar22),
                            auVar20);
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)(auVar5._0_4_ * fVar23)),auVar8,auVar20);
  auVar24 = ZEXT1664(auVar20);
  fVar22 = -1.0;
  fVar23 = auVar20._0_4_;
  if (fVar23 != 0.0) {
    auVar20 = vmovshdup_avx(auVar19);
    auVar4 = vmovshdup_avx(auVar18);
    fVar9 = fVar2 - c->m_floats[2];
    auVar5 = vsubps_avx(auVar19,auVar21);
    fVar10 = (float)*(ulong *)a->m_floats - (float)*(ulong *)b->m_floats;
    fVar11 = auVar4._0_4_ - auVar20._0_4_;
    auVar20 = vmovshdup_avx(auVar5);
    auVar6 = vfmsub231ss_fma(ZEXT416((uint)(fVar11 * fVar9)),auVar20,ZEXT416((uint)(fVar1 - fVar2)))
    ;
    auVar7 = vfmsub231ss_fma(ZEXT416((uint)((fVar1 - fVar2) * auVar5._0_4_)),ZEXT416((uint)fVar10),
                             ZEXT416((uint)fVar9));
    auVar5 = vfmsub231ss_fma(ZEXT416((uint)(auVar20._0_4_ * fVar10)),auVar5,ZEXT416((uint)fVar11));
    auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ * auVar7._0_4_)),auVar18,auVar6);
    auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar1),auVar5);
    if (fVar23 * auVar20._0_4_ <= 0.0) {
      fVar22 = -1.0;
      lVar15 = 0;
      uVar16 = 0;
      local_b8[2] = 0.0;
      local_b8[0] = 0.0;
      local_b8[1] = 0.0;
      local_c0 = 0;
      local_a8 = m;
      local_a0 = c;
      local_98 = b;
      local_90 = a;
      do {
        uVar3 = *(uint *)((long)projectorigin::imd3 + lVar15);
        uVar14 = (ulong)uVar3;
        lVar13 = uVar14 * 0x10;
        auVar20 = vfmsub231ss_fma(ZEXT416((uint)(*(float *)(local_88 + lVar13 + 4) *
                                                *(float *)(local_88 + lVar15 * 4 + 8))),
                                  ZEXT416((uint)*(float *)(local_88 + lVar15 * 4 + 4)),
                                  ZEXT416((uint)*(float *)(local_88 + lVar13 + 8)));
        auVar4 = vfmsub231ss_fma(ZEXT416((uint)(*(float *)(local_88 + lVar13 + 8) *
                                               *(float *)(local_88 + lVar15 * 4))),
                                 ZEXT416((uint)*(float *)(local_88 + lVar13)),
                                 ZEXT416((uint)*(float *)(local_88 + lVar15 * 4 + 8)));
        auVar5 = vfmsub231ss_fma(ZEXT416((uint)(*(float *)(local_88 + lVar13) *
                                               *(float *)(local_88 + lVar15 * 4 + 4))),
                                 ZEXT416((uint)*(float *)(local_88 + lVar15 * 4)),
                                 ZEXT416((uint)*(float *)(local_88 + lVar13 + 4)));
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar4._0_4_ * d->m_floats[1])),auVar20,
                                  ZEXT416((uint)d->m_floats[0]));
        auVar20 = vfmadd231ss_fma(auVar20,auVar5,ZEXT416((uint)d->m_floats[2]));
        if (0.0 < auVar24._0_4_ * auVar20._0_4_) {
          local_bc = fVar22;
          cVar17 = projectorigin(*(cbtVector3 **)((long)local_58 + lVar15 * 2),local_58[uVar14],d,
                                 local_b8,&local_c0);
          auVar24 = ZEXT464((uint)fVar23);
          if ((local_bc < 0.0) || (fVar22 = local_bc, cVar17 < local_bc)) {
            *local_a8 = (1 << (uVar3 & 0x1f) & (int)(local_c0 << 0x1e) >> 0x1f) + (local_c0 & 4) * 2
                        + (1 << (uVar16 & 0x1f) & -(local_c0 & 1));
            *(cbtScalar *)((long)w + lVar15) = local_b8[0];
            w[uVar14] = local_b8[1];
            w[projectorigin::imd3[uVar14]] = 0.0;
            w[3] = local_b8[2];
            fVar22 = cVar17;
          }
        }
        a_00 = local_98;
        b_00 = local_a0;
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0xc);
      if (fVar22 < 0.0) {
        *local_a8 = 0xf;
        cVar17 = det(local_a0,local_98,d);
        b_01 = local_90;
        *w = cVar17 / fVar23;
        cVar17 = det(local_90,b_00,d);
        w[1] = cVar17 / fVar23;
        cVar17 = det(a_00,b_01,d);
        fVar22 = 0.0;
        w[2] = cVar17 / fVar23;
        w[3] = 1.0 - (cVar17 / fVar23 + *w + w[1]);
      }
    }
  }
  return fVar22;
}

Assistant:

static cbtScalar projectorigin(const cbtVector3& a,
								  const cbtVector3& b,
								  const cbtVector3& c,
								  const cbtVector3& d,
								  cbtScalar* w, U& m)
	{
		static const U imd3[] = {1, 2, 0};
		const cbtVector3* vt[] = {&a, &b, &c, &d};
		const cbtVector3 dl[] = {a - d, b - d, c - d};
		const cbtScalar vl = det(dl[0], dl[1], dl[2]);
		const bool ng = (vl * cbtDot(a, cbtCross(b - c, a - b))) <= 0;
		if (ng && (cbtFabs(vl) > GJK_SIMPLEX4_EPS))
		{
			cbtScalar mindist = -1;
			cbtScalar subw[3] = {0.f, 0.f, 0.f};
			U subm(0);
			for (U i = 0; i < 3; ++i)
			{
				const U j = imd3[i];
				const cbtScalar s = vl * cbtDot(d, cbtCross(dl[i], dl[j]));
				if (s > 0)
				{
					const cbtScalar subd = projectorigin(*vt[i], *vt[j], d, subw, subm);
					if ((mindist < 0) || (subd < mindist))
					{
						mindist = subd;
						m = static_cast<U>((subm & 1 ? 1 << i : 0) +
										   (subm & 2 ? 1 << j : 0) +
										   (subm & 4 ? 8 : 0));
						w[i] = subw[0];
						w[j] = subw[1];
						w[imd3[j]] = 0;
						w[3] = subw[2];
					}
				}
			}
			if (mindist < 0)
			{
				mindist = 0;
				m = 15;
				w[0] = det(c, b, d) / vl;
				w[1] = det(a, c, d) / vl;
				w[2] = det(b, a, d) / vl;
				w[3] = 1 - (w[0] + w[1] + w[2]);
			}
			return (mindist);
		}
		return (-1);
	}